

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (column_index < 0) {
    column_index = (pIVar1->DC).ColumnsCurrent;
  }
  if (column_index < (pIVar1->DC).ColumnsData.Size) {
    fVar2 = (pIVar1->DC).ColumnsMinX;
    fVar2 = (offset - fVar2) / ((pIVar1->DC).ColumnsMaxX - fVar2);
    (pIVar1->DC).ColumnsData.Data[column_index].OffsetNorm = fVar2;
    ImGuiStorage::SetFloat((pIVar1->DC).StateStorage,column_index + (pIVar1->DC).ColumnsSetId,fVar2)
    ;
    return;
  }
  __assert_fail("column_index < window->DC.ColumnsData.Size",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                ,0x2459,"void ImGui::SetColumnOffset(int, float)");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);
    const float t = (offset - window->DC.ColumnsMinX) / (window->DC.ColumnsMaxX - window->DC.ColumnsMinX);
    window->DC.ColumnsData[column_index].OffsetNorm = t;

    const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
    window->DC.StateStorage->SetFloat(column_id, t);
}